

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch CVar1;
  bool bVar2;
  size_t sVar3;
  bool local_29;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *handler_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(is);
  if (CVar1 != 'n') {
    __assert_fail("is.Peek() == \'n\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                  ,0x359,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNull(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
  bVar2 = Consume<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,'u');
  local_29 = false;
  if (bVar2) {
    bVar2 = Consume<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,'l');
    local_29 = false;
    if (bVar2) {
      local_29 = Consume<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,'l');
    }
  }
  if (local_29 == false) {
    bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                    ,0x361,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNull(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    sVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(is);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this,kParseErrorValueInvalid,sVar3);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this);
  }
  else {
    bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Null(handler);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                      ,0x35e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNull(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar3 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(is);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorTermination,sVar3);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this);
    }
  }
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }